

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
betterThreshold<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *th,Real epsilon)

{
  bool bVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_188.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
  local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
  local_188.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
  local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
  local_188.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
  local_188.m_backend.exp = *(int *)(this + 0x28);
  local_188.m_backend.neg = *(bool *)(this + 0x2c);
  local_188.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,0.1,(type *)0x0);
  bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                    (&local_188,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68,1e-15);
  if (bVar1) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_288,10.0,(type *)0x0);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              ((cpp_dec_float<50U,_int,_void> *)this,&local_288);
  }
  else {
    local_1c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
    local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
    local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
    local_1c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
    local_1c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
    local_1c8.m_backend.exp = *(int *)(this + 0x28);
    local_1c8.m_backend.neg = *(bool *)(this + 0x2c);
    local_1c8.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&local_a0,0.9,(type *)0x0);
    bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_1c8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a0,epsilon);
    if (bVar1) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_d8,1.0,(type *)0x0);
      local_208.fpclass = cpp_dec_float_finite;
      local_208.prec_elem = 10;
      local_208.data._M_elems[0] = 0;
      local_208.data._M_elems[1] = 0;
      local_208.data._M_elems[2] = 0;
      local_208.data._M_elems[3] = 0;
      local_208.data._M_elems[4] = 0;
      local_208.data._M_elems[5] = 0;
      local_208.data._M_elems._24_5_ = 0;
      local_208.data._M_elems[7]._1_3_ = 0;
      local_208.data._M_elems._32_5_ = 0;
      local_208._37_8_ = 0;
      boost::multiprecision::default_ops::
      eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_208,(cpp_dec_float<50U,_int,_void> *)this,&local_d8);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_110,2.0,(type *)0x0);
      local_288.fpclass = cpp_dec_float_finite;
      local_288.prec_elem = 10;
      local_288.data._M_elems[0] = 0;
      local_288.data._M_elems[1] = 0;
      local_288.data._M_elems[2] = 0;
      local_288.data._M_elems[3] = 0;
      local_288.data._M_elems[4] = 0;
      local_288.data._M_elems[5] = 0;
      local_288.data._M_elems._24_5_ = 0;
      local_288.data._M_elems[7]._1_3_ = 0;
      local_288.data._M_elems._32_5_ = 0;
      local_288.data._M_elems[9]._1_3_ = 0;
      local_288.exp = 0;
      local_288.neg = false;
      boost::multiprecision::default_ops::
      eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_288,&local_208,&local_110);
      *(ulong *)(this + 0x20) =
           CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
      *(undefined8 *)(this + 0x10) = local_288.data._M_elems._16_8_;
      *(ulong *)(this + 0x18) =
           CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
      *(undefined8 *)this = local_288.data._M_elems._0_8_;
      *(undefined8 *)(this + 8) = local_288.data._M_elems._8_8_;
      *(int *)(this + 0x28) = local_288.exp;
      this[0x2c] = (soplex)local_288.neg;
    }
    else {
      local_248.m_backend.data._M_elems._32_8_ = *(undefined8 *)(this + 0x20);
      local_248.m_backend.data._M_elems._0_8_ = *(undefined8 *)this;
      local_248.m_backend.data._M_elems._8_8_ = *(undefined8 *)(this + 8);
      local_248.m_backend.data._M_elems._16_8_ = *(undefined8 *)(this + 0x10);
      local_248.m_backend.data._M_elems._24_8_ = *(undefined8 *)(this + 0x18);
      local_248.m_backend.exp = *(int *)(this + 0x28);
      local_248.m_backend.neg = *(bool *)(this + 0x2c);
      local_248.m_backend._48_8_ = *(undefined8 *)(this + 0x30);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_148,0.999,(type *)0x0);
      bVar1 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_248,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_148,epsilon);
      if (!bVar1) goto LAB_0017d5e8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&local_288,0.99999,(type *)0x0);
      *(ulong *)(this + 0x20) =
           CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
      *(undefined8 *)(this + 0x10) = local_288.data._M_elems._16_8_;
      *(ulong *)(this + 0x18) =
           CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
      *(undefined8 *)this = local_288.data._M_elems._0_8_;
      *(undefined8 *)(this + 8) = local_288.data._M_elems._8_8_;
      *(int *)(this + 0x28) = local_288.exp;
      this[0x2c] = (soplex)local_288.neg;
    }
    *(undefined8 *)(this + 0x30) = local_288._48_8_;
  }
LAB_0017d5e8:
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (&__return_storage_ptr__->m_backend,(cpp_dec_float<50U,_int,_void> *)this);
  return __return_storage_ptr__;
}

Assistant:

static R betterThreshold(R th, Real epsilon)
{
   assert(th < R(1.0));

   if(LT(th, R(0.1), 1e-15))
      th *= R(10.0);
   else if(LT(th, R(0.9), epsilon))
      th = (th + R(1.0)) / R(2.0);
   else if(LT(th, R(0.999), epsilon))
      th = R(0.99999);

   assert(th < R(1.0));

   return th;
}